

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.hpp
# Opt level: O0

void interpolative_internal::write_center_mid(bit_stream *os,uint64_t val,uint64_t u)

{
  uint32_t uVar1;
  uint uVar2;
  bit_stream *this;
  ulong uVar3;
  ulong in_RDX;
  long in_RSI;
  uint32_t m;
  uint64_t d;
  unsigned_long_long b;
  undefined4 in_stack_ffffffffffffffd0;
  undefined8 local_10;
  
  if (in_RDX != 1) {
    uVar1 = bits::hi(in_RDX - 1);
    this = (bit_stream *)((ulong)uVar1 + 1);
    uVar3 = in_RDX * 2 - (1L << ((byte)this & 0x3f));
    local_10 = in_RSI + (in_RDX - (uVar3 >> 1));
    if (in_RDX < local_10) {
      local_10 = local_10 - in_RDX;
    }
    uVar2 = (int)(1L << ((byte)this & 0x3f)) - (int)in_RDX;
    uVar1 = (uint32_t)(uVar3 >> 0x20);
    if (uVar2 < local_10) {
      bit_stream::put_int(this,uVar1,CONCAT44(uVar2,in_stack_ffffffffffffffd0));
      bit_stream::put_int(this,(uint32_t)(uVar3 >> 0x20),CONCAT44(uVar2,in_stack_ffffffffffffffd0));
    }
    else {
      bit_stream::put_int(this,uVar1,CONCAT44(uVar2,in_stack_ffffffffffffffd0));
    }
  }
  return;
}

Assistant:

static inline void write_center_mid(
        bit_stream& os, uint64_t val, uint64_t u)
    {
        if (u == 1)
            return;
        auto b = bits::hi(u - 1) + 1ULL;
        uint64_t d = 2ULL * u - (1ULL << b);
        val = val + (u - (d >> 1));
        if (val > u)
            val -= u;
        uint32_t m = (1ULL << b) - u;
        if (val <= m) {
            os.put_int(val - 1ULL, b - 1ULL);
        } else {
            val += m;
            os.put_int((val - 1ULL) >> 1ULL, b - 1ULL);
            os.put_int((val - 1ULL) & 1ULL, 1ULL);
        }
    }